

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O0

char * parse_content_sha_hdr(Curl_easy *data,char *provider1,size_t plen,size_t *value_len)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  size_t local_a0;
  size_t len;
  char *value;
  size_t key_len;
  char key [82];
  size_t *value_len_local;
  size_t plen_local;
  char *provider1_local;
  Curl_easy *data_local;
  
  unique0x100000c5 = value_len;
  iVar1 = curl_msnprintf((char *)&key_len,0x52,"x-%.*s-content-sha256",plen & 0xffffffff,provider1);
  value = (char *)(long)iVar1;
  len = (size_t)Curl_checkheaders(data,(char *)&key_len,(size_t)value);
  if ((char *)len == (char *)0x0) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    pcVar2 = strchr((char *)len,0x3a);
    if (pcVar2 == (char *)0x0) {
      data_local = (Curl_easy *)0x0;
    }
    else {
      len = (size_t)(pcVar2 + 1);
      Curl_str_passblanks((char **)&len);
      local_a0 = strlen((char *)len);
      while( true ) {
        bVar3 = false;
        if ((local_a0 != 0) && (bVar3 = true, *(char *)(len + (local_a0 - 1)) != ' ')) {
          bVar3 = *(char *)(len + (local_a0 - 1)) == '\t';
        }
        if (!bVar3) break;
        local_a0 = local_a0 - 1;
      }
      *stack0xffffffffffffffd0 = local_a0;
      data_local = (Curl_easy *)len;
    }
  }
  return (char *)data_local;
}

Assistant:

static const char *parse_content_sha_hdr(struct Curl_easy *data,
                                         const char *provider1,
                                         size_t plen,
                                         size_t *value_len)
{
  char key[CONTENT_SHA256_KEY_LEN];
  size_t key_len;
  const char *value;
  size_t len;

  key_len = msnprintf(key, sizeof(key), "x-%.*s-content-sha256",
                      (int)plen, provider1);

  value = Curl_checkheaders(data, key, key_len);
  if(!value)
    return NULL;

  value = strchr(value, ':');
  if(!value)
    return NULL;
  ++value;

  Curl_str_passblanks(&value);

  len = strlen(value);
  while(len > 0 && ISBLANK(value[len-1]))
    --len;

  *value_len = len;
  return value;
}